

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_123::AsyncPipe::writeWithFds
          (AsyncPipe *this,ArrayPtr<const_unsigned_char> data,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData,ArrayPtr<const_int> fds)

{
  AsyncCapabilityStream *pAVar1;
  AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite> *pAVar2;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> morePieces;
  void *pvVar3;
  ArrayPtr<const_unsigned_char> *pAVar4;
  uchar *puVar5;
  size_t *psVar6;
  long in_R9;
  bool bVar7;
  ArrayPtr<const_unsigned_char> writeBuffer;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Fault f;
  undefined1 local_68 [16];
  char *pcStack_58;
  undefined8 local_50;
  bool local_48;
  long local_40;
  Fault local_38;
  
  psVar6 = (size_t *)moreData.size_;
  pAVar4 = moreData.ptr;
  puVar5 = (uchar *)data.size_;
  while( true ) {
    pAVar2 = (AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite> *)
             fds.size_;
    if (pAVar4 != (ArrayPtr<const_unsigned_char> *)0x0) {
      pAVar1 = (((AsyncPipe *)data.ptr)->state).ptr;
      if (pAVar1 == (AsyncCapabilityStream *)0x0) {
        pvVar3 = operator_new(0x400);
        *(undefined8 *)((long)pvVar3 + 0x1d8) = 0;
        *(undefined8 *)((long)pvVar3 + 0x1e0) = 0;
        *(undefined ***)((long)pvVar3 + 0x1d0) = &PTR_destroy_005994c0;
        *(undefined ***)((long)pvVar3 + 0x1e8) = &PTR_reject_00599510;
        local_40 = (long)pvVar3 + 0x1f0;
        *(undefined1 *)((long)pvVar3 + 0x1f0) = 0;
        *(undefined1 *)((long)pvVar3 + 0x388) = 0;
        *(undefined1 *)((long)pvVar3 + 0x390) = 1;
        local_68._0_4_ = 1;
        local_68._8_8_ = fds.ptr;
        morePieces.size_._0_4_ = (int)in_R9;
        morePieces.ptr = (ArrayPtr<const_unsigned_char> *)psVar6;
        morePieces.size_._4_4_ = (int)((ulong)in_R9 >> 0x20);
        writeBuffer.size_ = (size_t)pAVar4;
        writeBuffer.ptr = puVar5;
        pcStack_58 = (char *)pAVar2;
        BlockedWrite::BlockedWrite
                  ((BlockedWrite *)((long)pvVar3 + 0x398),
                   (PromiseFulfiller<void> *)((long)pvVar3 + 0x1e8),(AsyncPipe *)data.ptr,
                   writeBuffer,morePieces,
                   (OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
                    *)local_68);
        OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
        ::~OneOf((OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
                  *)local_68);
        *(void **)((long)pvVar3 + 0x1d8) = pvVar3;
        local_68._0_8_ =
             (AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite> *)
             0x0;
        Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite>,_kj::_::PromiseDisposer>
        ::~Own((Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite>,_kj::_::PromiseDisposer>
                *)local_68);
        (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
        _vptr_AsyncInputStream = (_func_int **)((long)pvVar3 + 0x1d0);
        local_68._0_8_ =
             (AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite> *)
             0x0;
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_68);
      }
      else {
        (*(pAVar1->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[0xe])
                  (this,pAVar1,puVar5,pAVar4);
      }
      return (PromiseBase)(PromiseBase)this;
    }
    bVar7 = in_R9 == 0;
    in_R9 = in_R9 + -1;
    if (bVar7) break;
    puVar5 = (uchar *)*psVar6;
    pAVar4 = (ArrayPtr<const_unsigned_char> *)psVar6[1];
    psVar6 = psVar6 + 2;
  }
  local_68._8_8_ = local_68._8_8_ & 0xffffffff00000000;
  pcStack_58 = " == ";
  local_50 = 5;
  local_48 = pAVar2 == (AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite>
                        *)0x0;
  local_68._0_8_ = pAVar2;
  if (local_48) {
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[34]>
            (&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x151,FAILED,"fds.size() == 0","_kjCondition,\"can\'t attach FDs to empty message\"",
             (DebugComparison<unsigned_long,_int> *)local_68,
             (char (*) [34])"can\'t attach FDs to empty message");
  kj::_::Debug::Fault::fatal(&local_38);
}

Assistant:

Promise<void> writeWithFds(ArrayPtr<const byte> data,
                             ArrayPtr<const ArrayPtr<const byte>> moreData,
                             ArrayPtr<const int> fds) override {
    while (data.size() == 0 && moreData.size() > 0) {
      data = moreData.front();
      moreData = moreData.slice(1, moreData.size());
    }

    if (data.size() == 0) {
      KJ_REQUIRE(fds.size() == 0, "can't attach FDs to empty message");
      return READY_NOW;
    } else KJ_IF_SOME(s, state) {
      return s.writeWithFds(data, moreData, fds);
    } else {
      return newAdaptedPromise<void, BlockedWrite>(*this, data, moreData, fds);
    }
  }